

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O0

void QTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined4 *puVar2;
  bool bVar3;
  time_t tVar4;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int iVar5;
  code *in_RSI;
  QDateTimeEdit *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QTimeEdit *_t;
  undefined8 in_stack_ffffffffffffffa8;
  QDateTimeEdit *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (int)in_RSI;
  if ((iVar5 == 0) && (in_EDX == 0)) {
    in_RSI = (code *)(ulong)**(uint **)(in_RCX + 8);
    userTimeChanged((QTimeEdit *)0x563480,(QTime)(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  if (iVar5 == 5) {
    in_stack_ffffffffffffffc0 = (QDateTimeEdit *)0x0;
    in_RSI = userTimeChanged;
    bVar3 = QtMocHelpers::indexOfMethod<void(QTimeEdit::*)(QTime)>
                      (in_RCX,(void **)userTimeChanged,0,0);
    if (bVar3) goto LAB_0056353a;
  }
  if ((iVar5 == 1) && (puVar2 = *(undefined4 **)in_RCX, in_EDX == 0)) {
    tVar4 = QDateTimeEdit::time(in_RDI,(time_t *)in_RSI);
    *puVar2 = (int)tVar4;
  }
  if ((iVar5 == 2) && (in_EDX == 0)) {
    QDateTimeEdit::setTime(in_stack_ffffffffffffffc0,(QTime)0x2);
  }
LAB_0056353a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userTimeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeEdit::*)(QTime )>(_a, &QTimeEdit::userTimeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        default: break;
        }
    }
}